

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O1

bool __thiscall Kernel::Clause::isHorn(Clause *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  
  uVar2 = *(uint *)&this->field_0x38 & 0xfffff;
  bVar5 = uVar2 == 0;
  if (!bVar5) {
    bVar6 = ((this->_literals[0]->super_Term)._args[0]._content & 4) == 0;
    bVar1 = false;
    uVar3 = (uint)!bVar5;
    do {
      bVar5 = uVar2 <= uVar3;
      if (uVar2 <= uVar3) {
        return bVar5;
      }
      uVar4 = uVar3 + (uVar3 < uVar2);
      if (!bVar6 && !bVar1) {
        bVar1 = true;
      }
      bVar6 = ((this->_literals[(int)uVar3]->super_Term)._args[0]._content & 4) == 0;
      uVar3 = uVar4;
    } while ((bVar6) || (!bVar1));
  }
  return bVar5;
}

Assistant:

bool Clause::isHorn()
{
  bool posFound=false;
  for (Literal* l : iterLits()) {
    if (l->isPositive()) {
      if (posFound) {
        return false;
      }
      else {
        posFound=true;
      }
    }
  }
  return true;
}